

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O1

void main_posix(settings *par)

{
  int iVar1;
  pointer pcVar2;
  char cVar3;
  undefined8 uVar4;
  ostream *poVar5;
  tcp_cache_service srv;
  int sig;
  daemonizer demon;
  sigset_t wait_mask;
  intrusive_ptr<cppcms::impl::base_cache> local_138;
  tcp_cache_service local_130 [8];
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  int local_114;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  message local_f0 [48];
  daemonizer local_c0 [40];
  sigset_t local_98;
  
  cppcms::impl::daemonizer::daemonizer(local_c0,&par->config);
  local_138.p_ = (par->cache).p_;
  if (local_138.p_ != (base_cache *)0x0) {
    (**(code **)(*(long *)local_138.p_ + 0x30))();
  }
  local_128 = (par->sessions).
              super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_120 = (par->sessions).
              super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_120->_M_use_count = local_120->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_120->_M_use_count = local_120->_M_use_count + 1;
    }
  }
  iVar1 = par->threads;
  pcVar2 = (par->ip)._M_dataplus._M_p;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,pcVar2,pcVar2 + (par->ip)._M_string_length);
  cppcms::impl::tcp_cache_service::tcp_cache_service
            (local_130,&local_138,&local_128,iVar1,local_110,par->port,par->gc);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_138);
  sigemptyset(&local_98);
  sigaddset(&local_98,2);
  sigaddset(&local_98,3);
  sigaddset(&local_98,0xf);
  pthread_sigmask(0,&local_98,(__sigset_t *)0x0);
  local_114 = 0;
  sigwait(&local_98,&local_114);
  uVar4 = booster::log::logger::instance();
  cVar3 = booster::log::logger::should_be_logged(uVar4,0x32,"cppcms_scale");
  if (cVar3 != '\0') {
    booster::log::message::message
              (local_f0,0x32,"cppcms_scale",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/cache_server_main.cpp"
               ,0xca);
    poVar5 = (ostream *)booster::log::message::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Catch signal: exiting...",0x18);
    if (cVar3 != '\0') {
      booster::log::message::~message(local_f0);
    }
  }
  cppcms::impl::tcp_cache_service::stop();
  cppcms::impl::tcp_cache_service::~tcp_cache_service(local_130);
  cppcms::impl::daemonizer::~daemonizer(local_c0);
  return;
}

Assistant:

void main_posix(settings &par)
{
	cppcms::impl::daemonizer demon(par.config);

	cppcms::impl::tcp_cache_service srv(
		par.cache,
		par.sessions,
		par.threads,
		par.ip,
		par.port,
		par.gc);
	
	// Wait for signals for exit
	sigset_t wait_mask;
	sigemptyset(&wait_mask);
	sigaddset(&wait_mask, SIGINT);
	sigaddset(&wait_mask, SIGQUIT);
	sigaddset(&wait_mask, SIGTERM);
	pthread_sigmask(SIG_BLOCK, &wait_mask, 0);
	int sig = 0;
	sigwait(&wait_mask, &sig);
	
	BOOSTER_NOTICE("cppcms_scale")<<"Catch signal: exiting...";

	srv.stop();
}